

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O0

ErrorNumber
doRangeTestForOneOutput
          (RangeTestFunction testFunction,TA_FuncUnstId unstId,void *opaqueData,uint outputNb,
          uint integerTolerance)

{
  TA_RetCode TVar1;
  int iVar2;
  TA_Integer *outBegIdx;
  void *__ptr;
  undefined4 in_ECX;
  TA_Integer *unaff_RBX;
  TA_FuncUnstId in_ESI;
  undefined4 in_R8D;
  TA_Integer *unaff_R14;
  void *unaff_retaddr;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  uint *in_stack_00000010;
  uint outputIsInteger;
  TA_Integer temp;
  TA_Integer unstablePeriod;
  ErrorNumber errNb;
  TA_Integer *refBufferInt;
  TA_Real *refBuffer;
  uint in_stack_00000048;
  TA_Integer fixSize;
  TA_Integer refLookback;
  TA_Integer refOutNbElement;
  TA_Integer refOutBeg;
  TA_RetCode retCode;
  uint local_68;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar3;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  TA_Integer in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  ErrorNumber EVar4;
  
  showFeedback();
  outBegIdx = (TA_Integer *)malloc(0x7e0);
  if (outBegIdx == (TA_Integer *)0x0) {
    EVar4 = TA_TESTUTIL_DRT_ALLOC_ERR;
  }
  else {
    __ptr = malloc(0x3f0);
    if (__ptr == (void *)0x0) {
      free(outBegIdx);
      EVar4 = TA_TESTUTIL_DRT_ALLOC_ERR;
    }
    else {
      if (in_ESI != TA_FUNC_UNST_NONE) {
        TA_SetUnstablePeriod(in_ESI,0);
      }
      TVar1 = CallTestFunction((RangeTestFunction)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffc4,
                               in_stack_ffffffffffffffc0,
                               (TA_Real *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                               (TA_Integer *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               outBegIdx,unaff_RBX,unaff_R14,unaff_retaddr,in_stack_00000008,
                               in_stack_00000010);
      if (TVar1 == TA_SUCCESS) {
        if (in_stack_ffffffffffffffb8 == in_stack_ffffffffffffffc0) {
          if (0xfc - in_stack_ffffffffffffffb8 == in_stack_ffffffffffffffbc) {
            for (iVar3 = 1; iVar3 < 0xfd; iVar3 = iVar3 + 1) {
              if (in_ESI == TA_FUNC_UNST_NONE) {
                EVar4 = doRangeTestFixSize((RangeTestFunction)
                                           CONCAT44(in_stack_0000000c,in_stack_00000008),
                                           unaff_retaddr,(TA_Integer)((ulong)unaff_R14 >> 0x20),
                                           (TA_Integer)unaff_R14,
                                           (TA_Integer)((ulong)unaff_RBX >> 0x20),
                                           (TA_Real *)
                                           CONCAT44(in_stack_ffffffffffffffec,
                                                    in_stack_ffffffffffffffe8),_unstablePeriod,
                                           (TA_FuncUnstId)refBufferInt,(TA_Integer)refBuffer,
                                           in_stack_00000048,refLookback);
                if (EVar4 != TA_TEST_PASS) {
                  free(outBegIdx);
                  free(__ptr);
                  return EVar4;
                }
              }
              else {
                for (local_68 = 0; (int)local_68 < 0xfd; local_68 = local_68 + 1) {
                  TA_SetUnstablePeriod(in_ESI,local_68);
                  EVar4 = doRangeTestFixSize((RangeTestFunction)
                                             CONCAT44(in_stack_0000000c,in_stack_00000008),
                                             unaff_retaddr,(TA_Integer)((ulong)unaff_R14 >> 0x20),
                                             (TA_Integer)unaff_R14,
                                             (TA_Integer)((ulong)unaff_RBX >> 0x20),
                                             (TA_Real *)
                                             CONCAT44(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8),_unstablePeriod,
                                             (TA_FuncUnstId)refBufferInt,(TA_Integer)refBuffer,
                                             in_stack_00000048,refLookback);
                  if (EVar4 != TA_TEST_PASS) {
                    printf("Fail: Using unstable period %d\n",(ulong)local_68);
                    free(outBegIdx);
                    free(__ptr);
                    return EVar4;
                  }
                  if ((5 < (int)local_68) && ((int)local_68 < 0xf0)) {
                    iVar2 = rand();
                    local_68 = iVar2 % 0xf0 + local_68;
                    if (0xf0 < (int)local_68) {
                      local_68 = 0xf0;
                    }
                  }
                }
                if ((5 < iVar3) && (iVar3 < 0xf0)) {
                  iVar2 = rand();
                  iVar3 = iVar2 % 0xef + iVar3;
                  if (0xf0 < iVar3) {
                    iVar3 = 0xf0;
                  }
                }
              }
            }
            free(outBegIdx);
            free(__ptr);
            EVar4 = TA_TEST_PASS;
          }
          else {
            printf("Fail: doRangeTest either refOutNbElement or refLookback bad (%d,%d)\n",
                   (ulong)(0xfc - in_stack_ffffffffffffffb8),(ulong)in_stack_ffffffffffffffbc);
            free(outBegIdx);
            free(__ptr);
            EVar4 = TA_TESTUTIL_DRT_REF_OUTPUT_INCORRECT;
          }
        }
        else {
          printf("Fail: doRangeTest refLookback != refOutBeg (%d != %d)\n",
                 (ulong)in_stack_ffffffffffffffb8,(ulong)in_stack_ffffffffffffffc0);
          free(outBegIdx);
          free(__ptr);
          EVar4 = TA_TESTUTIL_DRT_LOOKBACK_INCORRECT;
        }
      }
      else {
        printf("Fail: doRangeTest whole range failed (%d)\n",(ulong)TVar1);
        free(outBegIdx);
        free(__ptr);
        EVar4 = TA_TESTUTIL_DRT_REF_FAILED;
      }
    }
  }
  return EVar4;
}

Assistant:

static ErrorNumber doRangeTestForOneOutput( RangeTestFunction testFunction,
                                            TA_FuncUnstId unstId,
                                            void *opaqueData,
                                            unsigned int outputNb,
                                            unsigned int integerTolerance )
{
   TA_RetCode retCode;
   TA_Integer refOutBeg, refOutNbElement, refLookback;
   TA_Integer fixSize;
   TA_Real *refBuffer;
   TA_Integer *refBufferInt;
   ErrorNumber errNb;
   TA_Integer unstablePeriod, temp;
   unsigned int outputIsInteger;

   showFeedback();

   /* Caculate the whole range. This is going
    * to be the reference for all subsequent test.
    */
   refBuffer = (TA_Real *)TA_Malloc( MAX_RANGE_SIZE * sizeof( TA_Real ) );

   if( !refBuffer )
      return TA_TESTUTIL_DRT_ALLOC_ERR;

   refBufferInt = (TA_Integer *)TA_Malloc( MAX_RANGE_SIZE * sizeof( TA_Integer ) );

   if( !refBufferInt )
   {
      TA_Free( refBuffer );
      return TA_TESTUTIL_DRT_ALLOC_ERR;
   }

   if( unstId != TA_FUNC_UNST_NONE )
   {
      /* Caller wish to test for a range of unstable
       * period values. But the reference is calculated
       * on the whole range by keeping that unstable period
       * to zero.
       */
      TA_SetUnstablePeriod( unstId, 0 );
   }

   outputIsInteger = 0;
   retCode = CallTestFunction( testFunction, 0, MAX_RANGE_END, refBuffer, refBufferInt,
                           &refOutBeg, &refOutNbElement, &refLookback,
                           opaqueData, outputNb, &outputIsInteger );

   if( retCode != TA_SUCCESS )
   {
      printf( "Fail: doRangeTest whole range failed (%d)\n", retCode );
      TA_Free( refBuffer );
      TA_Free( refBufferInt );
      return TA_TESTUTIL_DRT_REF_FAILED;
   }

   /* When calculating for the whole range, the lookback and the
    * refOutBeg are supppose to be equal.
    */
   if( refLookback != refOutBeg )
   {
      printf( "Fail: doRangeTest refLookback != refOutBeg (%d != %d)\n", refLookback, refOutBeg );
      TA_Free( refBuffer );
      TA_Free( refBufferInt );
      return TA_TESTUTIL_DRT_LOOKBACK_INCORRECT;
   }

   temp = MAX_RANGE_SIZE-refLookback;
   if( temp != refOutNbElement )
   {
      printf( "Fail: doRangeTest either refOutNbElement or refLookback bad (%d,%d)\n", temp, refOutNbElement );
      TA_Free( refBuffer );
      TA_Free( refBufferInt );
      return TA_TESTUTIL_DRT_REF_OUTPUT_INCORRECT;
   }

   /* Calculate each value ONE by ONE and make sure it is identical
    * to the reference.
    *
    * Then repeat the test but calculate TWO by TWO and so on...
    */
   for( fixSize=1; fixSize <= MAX_RANGE_SIZE; fixSize++ )
   {
      /* When a function has an unstable period, verify some
       * unstable period between 0 and MAX_RANGE_SIZE.
       */
      if( unstId == TA_FUNC_UNST_NONE )
      {
         errNb = doRangeTestFixSize( testFunction, opaqueData,
                                     refOutBeg, refOutNbElement, refLookback,
                                     refBuffer, refBufferInt,
                                     unstId, fixSize, outputNb, integerTolerance );
         if( errNb != TA_TEST_PASS)
         {
            TA_Free( refBuffer );
            TA_Free( refBufferInt );
            return errNb;
         }
      }
      else
      {
         for( unstablePeriod=0; unstablePeriod <= MAX_RANGE_SIZE; unstablePeriod++ )
         {
            TA_SetUnstablePeriod( unstId, unstablePeriod );

            errNb = doRangeTestFixSize( testFunction, opaqueData,
                                        refOutBeg, refOutNbElement, refLookback,
                                        refBuffer, refBufferInt,
                                        unstId, fixSize, outputNb, integerTolerance );
            if( errNb != TA_TEST_PASS)
            {
               printf( "Fail: Using unstable period %d\n", unstablePeriod );
               TA_Free( refBuffer );
               TA_Free( refBufferInt );
               return errNb;
            }

            /* Randomly skip the test of some unstable period (limit case are
             * always tested though).
             */
            if( (unstablePeriod > 5) && (unstablePeriod < 240) )
            {
               /* Randomly skips from 0 to 239 tests. Never
                * make unstablePeriod exceed 240.
                */
               temp = (rand() % 240);
               unstablePeriod += temp;
               if( unstablePeriod > 240 )
                  unstablePeriod = 240;
            }
         }

         /* Because the tests with an unstable period are very intensive
          * and kinda repetitive, skip the test of some fixSize (limit
          * case are always tested though).
          */
         if( (fixSize > 5) && (fixSize < 240) )
         {
            /* Randomly skips from 0 to 239 tests. Never
             * make fixSize exceed 240.
             */
            temp = (rand() % 239);
            fixSize += temp;
            if( fixSize > 240 )
               fixSize = 240;
         }
      }
   }

   TA_Free( refBuffer );
   TA_Free( refBufferInt );
   return TA_TEST_PASS;
}